

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

flatcc_builder_ref_t
flatcc_builder_create_buffer
          (flatcc_builder_t *B,char *identifier,uint16_t block_align,flatcc_builder_ref_t object_ref
          ,uint16_t align,flatcc_builder_buffer_flags_t flags)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint is_nested;
  int iVar9;
  bool bVar10;
  flatbuffers_uoffset_t buffer_size;
  flatbuffers_uoffset_t object_offset;
  flatcc_iov_state_t iov;
  int local_d0;
  int local_cc;
  int local_c8;
  ushort local_c2;
  ulong local_c0;
  uint local_b8;
  flatcc_iovec_t local_b0;
  void *apvStack_a0 [14];
  
  local_d0 = 0;
  is_nested = flags & 1;
  local_c2 = align;
  align_buffer_end(B,&local_c2,block_align,is_nested);
  if (B->min_align < local_c2) {
    B->min_align = local_c2;
  }
  if (identifier != (char *)0x0) {
    local_d0 = *(int *)identifier;
  }
  iVar1 = B->emit_start;
  local_c0 = 0;
  bVar10 = (flags & 3) != 0;
  if (bVar10) {
    local_c0 = 4;
    local_b0.iov_base = &local_cc;
    local_b0.iov_len = 4;
  }
  local_b8 = (uint)bVar10;
  uVar5 = ((iVar1 - ((uint)flags * 2 & 4)) + (uint)(local_d0 == 0) * 4) - 8 & local_c2 - 1;
  local_c0 = local_c0 + 4;
  lVar7 = (long)(int)local_b8;
  (&local_b0)[lVar7].iov_base = &local_c8;
  lVar6 = lVar7 + 1;
  apvStack_a0[lVar7 * 2 + -1] = (void *)0x4;
  uVar2 = (int)lVar6;
  if (local_d0 != 0) {
    pvVar4 = (void *)((ulong)(local_d0 != 0) * 4);
    local_c0 = local_c0 + (long)pvVar4;
    (&local_b0)[lVar6].iov_base = &local_d0;
    apvStack_a0[lVar6 * 2 + -1] = pvVar4;
    uVar2 = local_b8 + 2;
  }
  local_b8 = uVar2;
  if (uVar5 != 0) {
    local_c0 = local_c0 + (long)(ulong)uVar5;
    lVar6 = (long)(int)local_b8;
    local_b8 = local_b8 + 1;
    (&local_b0)[lVar6].iov_base = "";
    apvStack_a0[lVar6 * 2 + -1] = (void *)(ulong)uVar5;
  }
  iVar8 = (int)local_c0;
  iVar9 = iVar1 - iVar8;
  local_c8 = iVar9 + (uint)((flags & 3) != 0) * 4;
  local_cc = (&B->emit_end)[is_nested] - local_c8;
  local_c8 = object_ref - local_c8;
  if ((0x10000000 < local_c0 >> 4) || (iVar8 < 1)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x295,"flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)"
                 );
  }
  iVar3 = (*B->emit)(B->emit_context,&local_b0,local_b8,iVar9,local_c0);
  if (iVar3 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x299,"flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)"
                 );
  }
  B->emit_start = iVar9;
  if (iVar1 != iVar8) {
    return iVar9;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x313,
                "flatcc_builder_ref_t flatcc_builder_create_buffer(flatcc_builder_t *, const char *, uint16_t, flatcc_builder_ref_t, uint16_t, flatcc_builder_buffer_flags_t)"
               );
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_buffer(flatcc_builder_t *B,
        const char identifier[identifier_size], uint16_t block_align,
        flatcc_builder_ref_t object_ref, uint16_t align, flatcc_builder_buffer_flags_t flags)
{
    flatcc_builder_ref_t buffer_ref;
    uoffset_t header_pad, id_size = 0;
    uoffset_t object_offset, buffer_size, buffer_base;
    iov_state_t iov;
    flatcc_builder_identifier_t id_out = 0;
    int is_nested = (flags & flatcc_builder_is_nested) != 0;
    int with_size = (flags & flatcc_builder_with_size) != 0;

    if (align_buffer_end(B, &align, block_align, is_nested)) {
        return 0;
    }
    set_min_align(B, align);
    if (identifier) {
        FLATCC_ASSERT(sizeof(flatcc_builder_identifier_t) == identifier_size);
        FLATCC_ASSERT(sizeof(flatcc_builder_identifier_t) == field_size);
        memcpy(&id_out, identifier, identifier_size);
        id_out = __flatbuffers_thash_read_from_le(&id_out);
        write_identifier(&id_out, id_out);
    }
    id_size = id_out ? identifier_size : 0;
    header_pad = front_pad(B, field_size + id_size + (uoffset_t)(with_size ? field_size : 0), align);
    init_iov();
    /* ubyte vectors size field wrapping nested buffer. */
    push_iov_cond(&buffer_size, field_size, is_nested || with_size);
    push_iov(&object_offset, field_size);
    /* Identifiers are not always present in buffer. */
    push_iov(&id_out, id_size);
    push_iov(_pad, header_pad);
    buffer_base = (uoffset_t)B->emit_start - (uoffset_t)iov.len + (uoffset_t)((is_nested || with_size) ? field_size : 0);
    if (is_nested) {
        write_uoffset(&buffer_size, (uoffset_t)B->buffer_mark - buffer_base);
    } else {
        /* Also include clustered vtables. */
        write_uoffset(&buffer_size, (uoffset_t)B->emit_end - buffer_base);
    }
    write_uoffset(&object_offset, (uoffset_t)object_ref - buffer_base);
    if (0 == (buffer_ref = emit_front(B, &iov))) {
        check(0, "emitter rejected buffer content");
        return 0;
    }
    return buffer_ref;
}